

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

QAMList * __thiscall
OSTEI_VRR_Algorithm_Base::GetAMReq
          (QAMList *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  _Rb_tree_color rrstep;
  pointer pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  OSTEI_VRR_Algorithm_Base *this_00;
  pointer __x;
  QAMList *req2;
  QAMList req;
  QAMList local_e0;
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [24];
  
  local_68._0_4_ = (am->qam)._M_elems[0];
  local_68._4_4_ = (am->qam)._M_elems[1];
  local_68._8_4_ = (am->qam)._M_elems[2];
  local_68._12_4_ = (am->qam)._M_elems[3];
  pcVar1 = (am->tag)._M_dataplus._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (am->tag)._M_string_length);
  pmVar3 = std::
           map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
           ::at(&this->vrrmap_,(key_type *)local_68);
  rrstep = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  local_98._0_4_ = (am->qam)._M_elems[0];
  local_98._4_4_ = (am->qam)._M_elems[1];
  local_98._8_4_ = (am->qam)._M_elems[2];
  local_98._12_4_ = (am->qam)._M_elems[3];
  this_00 = (OSTEI_VRR_Algorithm_Base *)(am->tag)._M_dataplus._M_p;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,this_00,
             (long)(&(this_00->info_).super_GeneratorInfoBase.finalam_.qam + 0xffffffffffffffff) +
             (am->tag)._M_string_length);
  GenerateAMReq(&local_e0,this_00,(QAM *)local_98,rrstep,false);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __x = local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start;
    do {
      local_c8._0_4_ = (__x->qam)._M_elems[0];
      local_c8._4_4_ = (__x->qam)._M_elems[1];
      local_c8._8_4_ = (__x->qam)._M_elems[2];
      local_c8._12_4_ = (__x->qam)._M_elems[3];
      pcVar1 = (__x->tag)._M_dataplus._M_p;
      local_b8._M_p = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + (__x->tag)._M_string_length);
      bVar2 = ValidQAM((QAM *)local_c8);
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (bVar2) {
        std::vector<QAM,_std::allocator<QAM>_>::push_back(__return_storage_ptr__,__x);
      }
      __x = __x + 1;
    } while (__x != local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

QAMList OSTEI_VRR_Algorithm_Base::GetAMReq(QAM am) const
{
    RRStepType rrstep = GetRRStep(am);
    QAMList req = GenerateAMReq(am, rrstep);

    // remove invalid quartets
    QAMList req2;
    for(const auto & it : req)
    {
        if(ValidQAM(it))
            req2.push_back(it);
    }

    return req2;
}